

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O2

void __thiscall HPreData::makeACopy(HPreData *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  allocator_type local_45;
  value_type local_44;
  vector<int,_std::allocator<int>_> iwork;
  
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&iwork,(long)this->numColOriginal,&local_44,&local_45);
  this_00 = &this->Astart;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (this_00,(long)this->numColOriginal + 1,&local_44);
  uVar12 = (ulong)((long)(this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  iVar11 = (int)uVar12;
  std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,(long)iVar11);
  std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,(long)iVar11);
  piVar2 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  uVar12 = uVar12 & 0xffffffff;
  if (iVar11 < 1) {
    uVar12 = uVar9;
  }
  for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
    iVar11 = piVar2[uVar9];
    if (iVar11 < this->numColOriginal) {
      iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar11] = iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[iVar11] + 1;
    }
  }
  piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar7 = 1; uVar12 = (ulong)this->numColOriginal, lVar7 <= (long)uVar12; lVar7 = lVar7 + 1) {
    piVar2[lVar7] =
         iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar7 + -1] + piVar2[lVar7 + -1];
  }
  piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar7 = 0; lVar7 < (int)uVar12; lVar7 = lVar7 + 1) {
    iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = piVar2[lVar7];
    uVar12 = (ulong)(uint)this->numColOriginal;
  }
  piVar2 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = 0;
  while (lVar8 = lVar7, lVar8 < this->numRowOriginal) {
    piVar3 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar10 = (long)piVar2[lVar8]; lVar7 = lVar8 + 1, lVar10 < piVar2[lVar8 + 1];
        lVar10 = lVar10 + 1) {
      iVar11 = piVar3[lVar10];
      if (iVar11 != this->numColOriginal) {
        iVar1 = iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar11];
        iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [iVar11] = iVar1 + 1;
        piVar4[iVar1] = (int)lVar8;
        pdVar5[iVar1] = pdVar6[lVar10];
      }
    }
  }
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->Aend,(long)this->numColOriginal + 1,&local_44);
  piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (this->Aend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar7 = 0; lVar7 < this->numColOriginal; lVar7 = lVar7 + 1) {
    piVar3[lVar7] = piVar2[lVar7 + 1];
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&iwork.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void HPreData::makeACopy() {
    // Make a A copy

    int i,k;
    vector<int> iwork(numColOriginal, 0);
    Astart.assign(numColOriginal + 1, 0);
    int AcountX = ARindex.size();
    Aindex.resize(AcountX);
    Avalue.resize(AcountX);
    for (int k = 0; k < AcountX; k++)
    	if (ARindex[k] < numColOriginal)
    		iwork[ARindex[k]]++;
    for (i = 1; i <= numColOriginal; i++)
        Astart[i] = Astart[i - 1] + iwork[i - 1];
    for (i = 0; i < numColOriginal; i++)
        iwork[i] = Astart[i];
    for (int iRow = 0; iRow < numRowOriginal; iRow++) {
        for (k = ARstart[iRow]; k < ARstart[iRow + 1]; k++) {
            int iColumn = ARindex[k];
            if (iColumn != numColOriginal) {
				int iPut = iwork[iColumn]++;
				Aindex[iPut] = iRow;
				Avalue[iPut] = ARvalue[k];
            }
        }
    }

    Aend.resize(numColOriginal + 1, 0);
    for (i = 0; i < numColOriginal; i++)
        Aend[i] = Astart[i + 1];
}